

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void Catch::seedRng(IConfig *config)

{
  int iVar1;
  uint uVar2;
  
  iVar1 = (*(config->super_NonCopyable)._vptr_NonCopyable[0x10])();
  if (iVar1 != 0) {
    uVar2 = (*(config->super_NonCopyable)._vptr_NonCopyable[0x10])(config);
    srand(uVar2);
    rng();
    uVar2 = (*(config->super_NonCopyable)._vptr_NonCopyable[0x10])(config);
    clara::std::
    mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
    ::seed(&rng::s_rng,(ulong)uVar2);
    return;
  }
  return;
}

Assistant:

void seedRng( IConfig const& config ) {
        if( config.rngSeed() != 0 ) {
            std::srand( config.rngSeed() );
            rng().seed( config.rngSeed() );
        }
    }